

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  cmExportSet *pcVar1;
  cmTargetExport *targetExport;
  cmGeneratorTarget *target;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  TargetType TVar6;
  PolicyStatus PVar7;
  int iVar8;
  pointer ppcVar9;
  char *pcVar10;
  ostream *poVar11;
  string *psVar12;
  byte bVar13;
  char *pcVar14;
  bool bVar15;
  cmExportInstallFileGenerator *this_00;
  bool bVar16;
  string *c;
  pointer pbVar17;
  pointer ppcVar18;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar19;
  cmTargetExport *te;
  string expectedTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  string sep;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  string local_1c8;
  ostringstream e;
  undefined4 local_1a0 [2];
  undefined1 local_198 [24];
  undefined8 local_180;
  
  allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  expectedTargets._M_dataplus._M_p = (pointer)&expectedTargets.field_2;
  expectedTargets._M_string_length = 0;
  sep._M_dataplus._M_p = (pointer)&sep.field_2;
  sep._M_string_length = 0;
  expectedTargets.field_2._M_local_buf[0] = '\0';
  sep.field_2._M_local_buf[0] = '\0';
  pcVar1 = this->IEGen->ExportSet;
  ppcVar9 = (pcVar1->TargetExports).
            super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar18 = (pcVar1->TargetExports).
                  super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppcVar18 != ppcVar9; ppcVar18 = ppcVar18 + 1) {
    te = *ppcVar18;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &missingTargets,&sep,&(this->super_cmExportFileGenerator).Namespace);
    cmGeneratorTarget::GetExportName_abi_cxx11_(&local_1c8,te->Target);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &missingTargets,&local_1c8);
    std::__cxx11::string::append((string *)&expectedTargets);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&missingTargets);
    std::__cxx11::string::assign((char *)&sep);
    pVar19 = std::
             _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
             ::_M_insert_unique<cmGeneratorTarget*const&>
                       ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                         *)&(this->super_cmExportFileGenerator).ExportedTargets,&te->Target);
    if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar11 = std::operator<<((ostream *)&e,"install(EXPORT \"");
      poVar11 = std::operator<<(poVar11,(string *)&this->IEGen->ExportSet->Name);
      poVar11 = std::operator<<(poVar11,"\" ...) ");
      poVar11 = std::operator<<(poVar11,"includes target \"");
      psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(te->Target);
      poVar11 = std::operator<<(poVar11,(string *)psVar12);
      std::operator<<(poVar11,"\" more than once in the export set.");
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error((string *)&missingTargets);
      std::__cxx11::string::~string((string *)&missingTargets);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      std::__cxx11::string::~string((string *)&sep);
      std::__cxx11::string::~string((string *)&expectedTargets);
      bVar15 = false;
      goto LAB_00361e2d;
    }
    std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::push_back(&allTargets,&te);
  }
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])(this,os,&expectedTargets);
  std::__cxx11::string::~string((string *)&sep);
  std::__cxx11::string::~string((string *)&expectedTargets);
  this_00 = this;
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x13])(this,os);
  ppcVar18 = allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  missingTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  missingTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  missingTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar16 = false;
  bVar3 = false;
  bVar15 = false;
  bVar13 = 0;
  ppcVar9 = allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppcVar9 == ppcVar18) {
      if ((bVar3 || bVar15) || (bVar13 & 1) != 0) {
        pcVar10 = "2.8.12";
        if (bVar15) {
          pcVar10 = "3.0.0";
        }
        pcVar14 = "3.1.0";
        if (!bVar3) {
          pcVar14 = pcVar10;
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])(this,os,pcVar14);
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x14])(this,os);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x15])(this,os);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[9])(this,os);
      bVar15 = true;
      if (bVar16) {
        pbVar2 = (this->super_cmExportFileGenerator).Configurations.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar15 = true;
        for (pbVar17 = (this->super_cmExportFileGenerator).Configurations.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar17 != pbVar2;
            pbVar17 = pbVar17 + 1) {
          iVar8 = (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x16])
                            (this,pbVar17,&missingTargets);
          bVar15 = (bool)(bVar15 & (byte)iVar8);
        }
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])
                (this,os,&missingTargets);
      goto LAB_00361e23;
    }
    targetExport = *ppcVar9;
    target = targetExport->Target;
    TVar6 = GetExportTargetType(this_00,targetExport);
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
              (this,os,target,(ulong)TVar6);
    local_1a0[0] = 0;
    local_198._0_8_ = 0;
    local_198._8_8_ = local_1a0;
    local_180._0_1_ = false;
    local_180._1_7_ = 0;
    local_198._16_8_ = local_198._8_8_;
    cmExportFileGenerator::PopulateIncludeDirectoriesInterface
              (&this->super_cmExportFileGenerator,targetExport,InstallInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    cmExportFileGenerator::PopulateSourcesInterface
              (&this->super_cmExportFileGenerator,targetExport,InstallInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expectedTargets,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
               (allocator<char> *)&sep);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&expectedTargets,target,InstallInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&expectedTargets);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expectedTargets,"INTERFACE_COMPILE_DEFINITIONS",(allocator<char> *)&sep);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&expectedTargets,target,InstallInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&expectedTargets);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expectedTargets,"INTERFACE_COMPILE_OPTIONS",(allocator<char> *)&sep);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&expectedTargets,target,InstallInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&expectedTargets);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expectedTargets,"INTERFACE_AUTOUIC_OPTIONS",(allocator<char> *)&sep);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&expectedTargets,target,InstallInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&expectedTargets);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expectedTargets,"INTERFACE_COMPILE_FEATURES",(allocator<char> *)&sep);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&expectedTargets,target,InstallInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&expectedTargets);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expectedTargets,"INTERFACE_LINK_OPTIONS",(allocator<char> *)&sep);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&expectedTargets,target,InstallInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&expectedTargets);
    cmExportFileGenerator::PopulateLinkDirectoriesInterface
              (&this->super_cmExportFileGenerator,targetExport,InstallInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    cmExportFileGenerator::PopulateLinkDependsInterface
              (&this->super_cmExportFileGenerator,targetExport,InstallInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    expectedTargets._M_dataplus._M_p = (pointer)&expectedTargets.field_2;
    expectedTargets._M_string_length = 0;
    expectedTargets.field_2._M_local_buf[0] = '\0';
    bVar4 = cmExportFileGenerator::PopulateExportProperties
                      (&this->super_cmExportFileGenerator,target,(ImportPropertyMap *)&e,
                       &expectedTargets);
    if (bVar4) {
      PVar7 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
      if (((PVar7 != WARN) &&
          (PVar7 = cmGeneratorTarget::GetPolicyStatusCMP0022(target), PVar7 != OLD)) &&
         (bVar5 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                            (&this->super_cmExportFileGenerator,target,InstallInterface,
                             (ImportPropertyMap *)&e,&missingTargets), bVar5)) {
        bVar13 = bVar13 | (this->super_cmExportFileGenerator).ExportOld ^ 1U;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sep,"INTERFACE_SOURCES",(allocator<char> *)&local_1c8);
      pcVar10 = cmGeneratorTarget::GetProperty(target,&sep);
      std::__cxx11::string::~string((string *)&sep);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sep,"INTERFACE_POSITION_INDEPENDENT_CODE",(allocator<char> *)&local_1c8)
      ;
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&sep,target,(ImportPropertyMap *)&e);
      std::__cxx11::string::~string((string *)&sep);
      cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                (&this->super_cmExportFileGenerator,target,(ImportPropertyMap *)&e);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])(this,target,os,&e);
      bVar15 = (bool)(bVar15 | TVar6 == INTERFACE_LIBRARY);
      bVar3 = (bool)(bVar3 | pcVar10 != (char *)0x0);
    }
    else {
      cmSystemTools::Error(&expectedTargets);
    }
    bVar16 = (bool)(bVar16 | TVar6 != INTERFACE_LIBRARY);
    std::__cxx11::string::~string((string *)&expectedTargets);
    this_00 = (cmExportInstallFileGenerator *)&e;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)this_00);
    ppcVar9 = ppcVar9 + 1;
  } while (bVar4);
  bVar15 = false;
LAB_00361e23:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&missingTargets);
LAB_00361e2d:
  std::_Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::~_Vector_base
            (&allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>);
  return bVar15;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
    std::string expectedTargets;
    std::string sep;
    for (cmTargetExport* te :
         *this->IEGen->GetExportSet()->GetTargetExports()) {
      expectedTargets += sep + this->Namespace + te->Target->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te->Target).second) {
        allTargets.push_back(te);
      } else {
        std::ostringstream e;
        e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
          << "\" ...) "
          << "includes target \"" << te->Target->GetName()
          << "\" more than once in the export set.";
        cmSystemTools::Error(e.str());
        return false;
      }
    }

    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Compute the relative import prefix for the file
  this->GenerateImportPrefix(os);

  std::vector<std::string> missingTargets;

  bool require2_8_12 = false;
  bool require3_0_0 = false;
  bool require3_1_0 = false;
  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for (cmTargetExport* te : allTargets) {
    cmGeneratorTarget* gt = te->Target;
    cmStateEnums::TargetType targetType = this->GetExportTargetType(te);

    requiresConfigFiles =
      requiresConfigFiles || targetType != cmStateEnums::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, gt, targetType);

    ImportPropertyMap properties;

    this->PopulateIncludeDirectoriesInterface(
      te, cmGeneratorExpression::InstallInterface, properties, missingTargets);
    this->PopulateSourcesInterface(te, cmGeneratorExpression::InstallInterface,
                                   properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateLinkDirectoriesInterface(
      te, cmGeneratorExpression::InstallInterface, properties, missingTargets);
    this->PopulateLinkDependsInterface(
      te, cmGeneratorExpression::InstallInterface, properties, missingTargets);

    std::string errorMessage;
    if (!this->PopulateExportProperties(gt, properties, errorMessage)) {
      cmSystemTools::Error(errorMessage);
      return false;
    }

    const bool newCMP0022Behavior =
      gt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gt->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      if (this->PopulateInterfaceLinkLibrariesProperty(
            gt, cmGeneratorExpression::InstallInterface, properties,
            missingTargets) &&
          !this->ExportOld) {
        require2_8_12 = true;
      }
    }
    if (targetType == cmStateEnums::INTERFACE_LIBRARY) {
      require3_0_0 = true;
    }
    if (gt->GetProperty("INTERFACE_SOURCES")) {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      require3_1_0 = true;
    }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gt,
                                    properties);

    this->PopulateCompatibleInterfaceProperties(gt, properties);

    this->GenerateInterfaceProperties(gt, os, properties);
  }

  if (require3_1_0) {
    this->GenerateRequiredCMakeVersion(os, "3.1.0");
  } else if (require3_0_0) {
    this->GenerateRequiredCMakeVersion(os, "3.0.0");
  } else if (require2_8_12) {
    this->GenerateRequiredCMakeVersion(os, "2.8.12");
  }

  this->LoadConfigFiles(os);

  this->CleanupTemporaryVariables(os);
  this->GenerateImportedFileCheckLoop(os);

  bool result = true;
  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles) {
    for (std::string const& c : this->Configurations) {
      if (!this->GenerateImportFileConfig(c, missingTargets)) {
        result = false;
      }
    }
  }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return result;
}